

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O2

uint64_t uv_get_constrained_memory(void)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t rc;
  char buf [32];
  char filename [256];
  
  rc = 0;
  snprintf(filename,0x100,"/sys/fs/cgroup/%s/%s","memory","memory.limit_in_bytes");
  iVar1 = uv__slurp(filename,buf,0x20);
  uVar2 = 0;
  if (iVar1 == 0) {
    sscanf(buf,"%lu",&rc);
    uVar2 = rc;
  }
  return uVar2;
}

Assistant:

static uint64_t uv__read_cgroups_uint64(const char* cgroup, const char* param) {
  char filename[256];
  char buf[32];  /* Large enough to hold an encoded uint64_t. */
  uint64_t rc;

  rc = 0;
  snprintf(filename, sizeof(filename), "/sys/fs/cgroup/%s/%s", cgroup, param);
  if (0 == uv__slurp(filename, buf, sizeof(buf)))
    sscanf(buf, "%" PRIu64, &rc);

  return rc;
}